

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cm_lock.c
# Opt level: O0

void IntCManager_lock(CManager cm,char *file,int line)

{
  FILE *__stream;
  int iVar1;
  __pid_t _Var2;
  pthread_t pVar3;
  uint in_EDX;
  undefined8 in_RSI;
  long in_RDI;
  CMTraceType in_stack_0000000c;
  timespec ts;
  timespec local_28;
  uint local_14;
  undefined8 local_10;
  long local_8;
  
  local_14 = in_EDX;
  local_10 = in_RSI;
  local_8 = in_RDI;
  if (*(long *)(in_RDI + 0x120) == 0) {
    iVar1 = CMtrace_init((CManager)ts.tv_sec,in_stack_0000000c);
    if (iVar1 == 0) goto LAB_0012d010;
  }
  else if (CMtrace_val[3] == 0) goto LAB_0012d010;
  if (CMtrace_PID != 0) {
    __stream = *(FILE **)(local_8 + 0x120);
    _Var2 = getpid();
    pVar3 = pthread_self();
    fprintf(__stream,"P%lxT%lx - ",(long)_Var2,pVar3);
  }
  if (CMtrace_timing != 0) {
    clock_gettime(1,&local_28);
    fprintf(*(FILE **)(local_8 + 0x120),"%lld.%.9ld - ",local_28.tv_sec,local_28.tv_nsec);
  }
  fprintf(*(FILE **)(local_8 + 0x120),"CManager Lock at \"%s\" line %d\n",local_10,(ulong)local_14);
LAB_0012d010:
  fflush(*(FILE **)(local_8 + 0x120));
  pthread_mutex_lock((pthread_mutex_t *)(local_8 + 0x78));
  *(int *)(local_8 + 0xa0) = *(int *)(local_8 + 0xa0) + 1;
  if (*(int *)(local_8 + 0xa0) != 1) {
    printf("CManager lock inconsistency, %d\n",(ulong)*(uint *)(local_8 + 0xa0));
  }
  return;
}

Assistant:

extern void
IntCManager_lock(CManager cm, const char *file, int line)
{
    CMtrace_out(cm, CMLowLevelVerbose, "CManager Lock at \"%s\" line %d\n",
		file, line);
    thr_mutex_lock(cm->exchange_lock);
    cm->locked++;
    if (cm->locked != 1) {
	printf("CManager lock inconsistency, %d\n", cm->locked);
    }
}